

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void save(LexerState *ls,int c)

{
  TextBuffer *mb;
  ulong uVar1;
  size_t sVar2;
  
  mb = ls->buff;
  uVar1 = mb->capacity;
  if (uVar1 < mb->pos + 1) {
    if (0x3ffffffe < uVar1) {
      raviX_buffer_add_fstring
                (&ls->compiler_state->error_message,"%s(%d): %s",ls->source,
                 (ulong)(uint)ls->linenumber,"lexical element too long");
      longjmp((__jmp_buf_tag *)ls->compiler_state->env,1);
    }
    sVar2 = 0x20;
    if (uVar1 != 0) {
      sVar2 = uVar1 * 2;
    }
    raviX_buffer_resize(mb,sVar2);
  }
  sVar2 = mb->pos;
  mb->pos = sVar2 + 1;
  mb->buf[sVar2] = (char)c;
  if (mb->pos < mb->capacity) {
    return;
  }
  __assert_fail("mb->pos < mb->capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/membuf.h"
                ,0x2f,"void raviX_buffer_addc(TextBuffer *, int)");
}

Assistant:

static void save(LexerState *ls, int c)
{
	TextBuffer *b = ls->buff;
	if (raviX_buffer_len(b) + 1 > raviX_buffer_size(b)) {
		size_t newsize;
		if (raviX_buffer_size(b) >= INT_MAX / 2)
			lexerror(ls, "lexical element too long", 0);
		size_t oldsize = raviX_buffer_size(b);
		if (oldsize == 0)
			newsize = 32;
		else
			newsize = oldsize * 2;
		raviX_buffer_resize(b, newsize);
	}
	raviX_buffer_addc(b, c);
}